

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::~ansicolor_sink
          (ansicolor_sink<spdlog::details::console_mutex> *this)

{
  ansicolor_sink<spdlog::details::console_mutex> *in_RDI;
  
  ~ansicolor_sink(in_RDI);
  operator_delete(in_RDI,0x2c0);
  return;
}

Assistant:

~ansicolor_sink() override = default;